

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void set_remove_node(lyxp_set *set,uint32_t idx)

{
  lyxp_set_nodes *__ptr;
  uint32_t uVar1;
  
  if (set->type != LYXP_SET_NODE_SET) {
    __assert_fail("set && (set->type == LYXP_SET_NODE_SET)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                  ,0x2ff,"void set_remove_node(struct lyxp_set *, uint32_t)");
  }
  if (idx < set->used) {
    uVar1 = set->used - 1;
    set->used = uVar1;
    __ptr = (set->val).nodes;
    if (uVar1 != 0) {
      memmove(__ptr + idx,__ptr + (idx + 1),(ulong)(uVar1 - idx) << 4);
      return;
    }
    free(__ptr);
    set->used = 0;
    set->size = 0;
    set->ctx_pos = 0;
    set->ctx_size = 0;
    (set->val).nodes = (lyxp_set_nodes *)0x0;
    *(undefined8 *)((long)&set->val + 8) = 0;
    *(undefined8 *)set = 0;
    *(undefined8 *)&set->field_0x8 = 0;
    return;
  }
  __assert_fail("idx < set->used",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                ,0x300,"void set_remove_node(struct lyxp_set *, uint32_t)");
}

Assistant:

static void
set_remove_node(struct lyxp_set *set, uint32_t idx)
{
    assert(set && (set->type == LYXP_SET_NODE_SET));
    assert(idx < set->used);

    --set->used;
    if (set->used) {
        memmove(&set->val.nodes[idx], &set->val.nodes[idx + 1],
                (set->used - idx) * sizeof *set->val.nodes);
    } else {
        free(set->val.nodes);
        /* this changes it to LYXP_SET_EMPTY */
        memset(set, 0, sizeof *set);
    }
}